

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_idx_abc(jit_State *J,TRef asizeref,TRef ikey,uint32_t asize)

{
  IRIns *pIVar1;
  IRRef1 IVar2;
  IRIns *pIVar4;
  ulong uVar5;
  int iVar6;
  IRRef1 IVar7;
  uint uVar8;
  TRef TVar3;
  
  if ((~J->flags & 0xc00000) == 0) {
    uVar8 = ikey & 0xffff;
    pIVar1 = (J->cur).ir;
    pIVar4 = pIVar1 + uVar8;
    if ((pIVar4->field_1).o == ')') {
      IVar7 = (pIVar4->field_0).op2;
      if ((long)(short)IVar7 < 0) goto LAB_00152fed;
      iVar6 = pIVar1[(short)IVar7].i;
      uVar8 = (uint)(pIVar4->field_0).op1;
      pIVar4 = pIVar1 + (pIVar4->field_0).op1;
    }
    else {
LAB_00152fed:
      iVar6 = 0;
      IVar7 = 0;
    }
    if ((uVar8 == (J->scev).idx) &&
       ((ulong)((long)(int)J->L->base[((ulong)(pIVar4->field_0).op1 + 1) - (ulong)J->baseslot].n +
               (long)iVar6) < (ulong)asize)) {
      IVar2 = (J->scev).stop;
      if (iVar6 != 0) {
        (J->fold).ins.field_0.ot = 0x2913;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = IVar7;
        TVar3 = lj_opt_fold(J);
        IVar2 = (IRRef1)TVar3;
      }
      (J->fold).ins.field_0.ot = 0xa85;
      (J->fold).ins.field_0.op1 = (IRRef1)asizeref;
      (J->fold).ins.field_0.op2 = IVar2;
      lj_opt_fold(J);
      if ((((J->scev).dir != '\0') && (uVar5 = (ulong)(J->scev).start, uVar5 != 0)) &&
         (-1 < (long)(J->cur).ir[uVar5].i + (long)iVar6)) {
        return;
      }
      (J->fold).ins.field_0.ot = 0xa85;
      goto LAB_001530b1;
    }
  }
  (J->fold).ins.field_0.ot = 0xa93;
LAB_001530b1:
  (J->fold).ins.field_0.op1 = (IRRef1)asizeref;
  (J->fold).ins.field_0.op2 = (IRRef1)ikey;
  lj_opt_fold(J);
  return;
}

Assistant:

static void rec_idx_abc(jit_State *J, TRef asizeref, TRef ikey, uint32_t asize)
{
  /* Try to emit invariant bounds checks. */
  if ((J->flags & (JIT_F_OPT_LOOP|JIT_F_OPT_ABC)) ==
      (JIT_F_OPT_LOOP|JIT_F_OPT_ABC)) {
    IRRef ref = tref_ref(ikey);
    IRIns *ir = IR(ref);
    int32_t ofs = 0;
    IRRef ofsref = 0;
    /* Handle constant offsets. */
    if (ir->o == IR_ADD && irref_isk(ir->op2)) {
      ofsref = ir->op2;
      ofs = IR(ofsref)->i;
      ref = ir->op1;
      ir = IR(ref);
    }
    /* Got scalar evolution analysis results for this reference? */
    if (ref == J->scev.idx) {
      int32_t stop;
      lj_assertJ(irt_isint(J->scev.t) && ir->o == IR_SLOAD,
		 "only int SCEV supported");
      stop = numberVint(&(J->L->base - J->baseslot)[ir->op1 + FORL_STOP]);
      /* Runtime value for stop of loop is within bounds? */
      if ((uint64_t)stop + ofs < (uint64_t)asize) {
	/* Emit invariant bounds check for stop. */
	emitir(IRTG(IR_ABC, IRT_P32), asizeref, ofs == 0 ? J->scev.stop :
	       emitir(IRTI(IR_ADD), J->scev.stop, ofsref));
	/* Emit invariant bounds check for start, if not const or negative. */
	if (!(J->scev.dir && J->scev.start &&
	      (int64_t)IR(J->scev.start)->i + ofs >= 0))
	  emitir(IRTG(IR_ABC, IRT_P32), asizeref, ikey);
	return;
      }
    }
  }
  emitir(IRTGI(IR_ABC), asizeref, ikey);  /* Emit regular bounds check. */
}